

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sSimulationDataGenerator.cpp
# Opt level: O2

BitState __thiscall I2sSimulationDataGenerator::GetNextFrameBit(I2sSimulationDataGenerator *this)

{
  BitState BVar1;
  pointer pBVar2;
  pointer pBVar3;
  uint uVar4;
  
  pBVar2 = (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar3 = (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
           super__Vector_impl_data._M_finish;
  BVar1 = pBVar2[this->mCurrentFrameBitIndex];
  uVar4 = this->mCurrentFrameBitIndex + 1;
  this->mCurrentFrameBitIndex = uVar4;
  if ((ulong)((long)pBVar3 - (long)pBVar2 >> 2) <= (ulong)uVar4) {
    this->mCurrentFrameBitIndex = 0;
  }
  return BVar1;
}

Assistant:

BitState I2sSimulationDataGenerator::GetNextFrameBit()
{
    BitState bit_state = mFrameBits[ mCurrentFrameBitIndex ];
    mCurrentFrameBitIndex++;
    if( mCurrentFrameBitIndex >= mFrameBits.size() )
        mCurrentFrameBitIndex = 0;
    return bit_state;
}